

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadIndexData(ColladaParser *this,Mesh *pMesh)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  byte *pbVar13;
  size_t sVar14;
  undefined4 extraout_var_12;
  ostream *poVar15;
  ulong uVar16;
  ulong __n;
  char *pElement;
  string elementName;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vcount;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> perIndexData
  ;
  SubMesh subgroup;
  PrimitiveType local_280;
  ulong local_268;
  long *local_258;
  long local_250;
  long local_248 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> local_218;
  string local_1f8;
  value_type local_1d8;
  char *local_1b0;
  string local_1a8 [11];
  
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = GetAttribute(this,"count");
  iVar10 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar9);
  iVar11 = TestAttribute(this,"material");
  local_1d8.mMaterial._M_dataplus._M_p = (pointer)&local_1d8.mMaterial.field_2;
  local_1d8.mMaterial._M_string_length = 0;
  local_1d8.mMaterial.field_2._M_local_buf[0] = '\0';
  if (-1 < iVar11) {
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[6])();
    sVar6 = local_1d8.mMaterial._M_string_length;
    strlen((char *)CONCAT44(extraout_var,iVar11));
    std::__cxx11::string::_M_replace
              ((ulong)&local_1d8,0,(char *)sVar6,CONCAT44(extraout_var,iVar11));
  }
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,(char *)CONCAT44(extraout_var_00,iVar11),
             (allocator<char> *)local_1a8);
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar11 != 1) {
LAB_00439488:
    __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                  ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
  }
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar11 = strcmp((char *)CONCAT44(extraout_var_01,iVar11),"lines");
  if (iVar11 == 0) {
    local_280 = Prim_Lines;
    goto LAB_004390f9;
  }
  iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar12 != 1) goto LAB_00439488;
  iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar12 = strcmp((char *)CONCAT44(extraout_var_02,iVar12),"linestrips");
  if (iVar12 == 0) {
    local_280 = Prim_LineStrip;
    bVar3 = true;
    bVar7 = false;
    bVar4 = false;
    bVar5 = false;
    goto LAB_00439113;
  }
  iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar12 != 1) goto LAB_00439488;
  iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar12 = strcmp((char *)CONCAT44(extraout_var_03,iVar12),"polygons");
  if (iVar12 == 0) {
    local_280 = Prim_Polygon;
LAB_004390f9:
    bVar4 = false;
LAB_00439103:
    bVar5 = false;
  }
  else {
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar12 != 1) goto LAB_00439488;
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar12 = strcmp((char *)CONCAT44(extraout_var_04,iVar12),"polylist");
    if (iVar12 == 0) {
      local_280 = Prim_Polylist;
      goto LAB_004390f9;
    }
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar12 != 1) goto LAB_00439488;
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar12 = strcmp((char *)CONCAT44(extraout_var_05,iVar12),"triangles");
    if (iVar12 == 0) {
      local_280 = Prim_Triangles;
      goto LAB_004390f9;
    }
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar12 != 1) goto LAB_00439488;
    iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar12 = strcmp((char *)CONCAT44(extraout_var_06,iVar12),"trifans");
    if (iVar12 == 0) {
      local_280 = Prim_TriFans;
      bVar4 = true;
      goto LAB_00439103;
    }
    bVar7 = IsElement(this,"tristrips");
    if (!bVar7) {
      bVar4 = false;
      bVar7 = true;
      bVar5 = false;
      bVar3 = false;
      local_280 = Prim_Invalid;
      goto LAB_00439113;
    }
    local_280 = Prim_TriStrips;
    bVar5 = true;
    bVar4 = false;
  }
  bVar7 = false;
  bVar3 = false;
LAB_00439113:
  if (bVar7) {
    __assert_fail("primType != Prim_Invalid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                  ,0x97b,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  __n = (ulong)iVar10;
  local_268 = 0;
  do {
    while( true ) {
      iVar12 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar12 == '\0') goto LAB_00439399;
      iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      p_Var1 = this->mReader->_vptr_IIrrXMLReader[3];
      if (iVar12 != 1) break;
      iVar12 = (*p_Var1)();
      if (iVar12 != 1) goto LAB_00439488;
      iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar12 = strcmp((char *)CONCAT44(extraout_var_07,iVar12),"input");
      if (iVar12 == 0) {
        ReadInputChannel(this,&local_218);
      }
      else {
        iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar12 != 1) goto LAB_00439488;
        iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar12 = strcmp((char *)CONCAT44(extraout_var_08,iVar12),"vcount");
        pp_Var2 = this->mReader->_vptr_IIrrXMLReader;
        if (iVar12 == 0) {
          iVar12 = (*pp_Var2[0xf])();
          if ((char)iVar12 == '\0') {
            if (iVar10 != 0) {
              pbVar13 = (byte *)GetTextContent(this);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_238,__n);
              uVar16 = 0;
              do {
                if (*pbVar13 == 0) {
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,
                             "Expected more values while reading <vcount> contents.","");
                  ThrowException(this,local_1a8);
                }
                bVar8 = *pbVar13;
                if ((byte)(bVar8 - 0x3a) < 0xf6) {
                  local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
                }
                else {
                  uVar9 = 0;
                  do {
                    uVar9 = (uint)(byte)(bVar8 - 0x30) + uVar9 * 10;
                    bVar8 = pbVar13[1];
                    pbVar13 = pbVar13 + 1;
                  } while (0xf5 < (byte)(bVar8 - 0x3a));
                  local_1a8[0]._M_dataplus._M_p = (pointer)(ulong)uVar9;
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&local_238,(unsigned_long *)local_1a8);
                while (((ulong)*pbVar13 < 0x21 &&
                       ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
                  pbVar13 = pbVar13 + 1;
                }
                uVar16 = (ulong)((int)uVar16 + 1);
              } while (uVar16 < __n);
            }
            TestClosing(this,"vcount");
          }
        }
        else {
          iVar12 = (*pp_Var2[3])();
          if (iVar12 != 1) goto LAB_00439488;
          iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar12 = strcmp((char *)CONCAT44(extraout_var_09,iVar12),"p");
          pp_Var2 = this->mReader->_vptr_IIrrXMLReader;
          if (iVar12 == 0) {
            iVar12 = (*pp_Var2[0xf])();
            if ((char)iVar12 == '\0') {
              sVar14 = ReadPrimitives(this,pMesh,&local_218,__n,&local_238,local_280);
              local_268 = local_268 + sVar14;
            }
          }
          else {
            iVar12 = (*pp_Var2[3])();
            if (iVar12 != 1) goto LAB_00439488;
            iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            pElement = "extra";
            iVar12 = strcmp((char *)CONCAT44(extraout_var_10,iVar12),"extra");
            if (iVar12 != 0) {
              iVar12 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar12 != 1) goto LAB_00439488;
              iVar12 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              pElement = "ph";
              iVar12 = strcmp((char *)CONCAT44(extraout_var_11,iVar12),"ph");
              if (iVar12 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Unexpected sub element <",0x18);
                iVar10 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                local_1b0 = (char *)CONCAT44(extraout_var_12,iVar10);
                poVar15 = (ostream *)
                          Formatter::
                          basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                          operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                      *)local_1a8,&local_1b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"> in tag <",10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(char *)local_258,local_250);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,">",1);
                std::__cxx11::stringbuf::str();
                ThrowException(this,&local_1f8);
              }
            }
            SkipElement(this,pElement);
          }
        }
      }
    }
    iVar12 = (*p_Var1)();
  } while (iVar12 != 2);
  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar10 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar10 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected end of <",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_258,local_250);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"> element.",10);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1f8);
  }
LAB_00439399:
  if (((iVar11 != 0) && ((!bVar4 && !bVar5) && !bVar3)) && (local_268 != __n)) {
    __assert_fail("actualPrimitives == numPrimitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                  ,0x9bc,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  local_1d8.mNumFaces = local_268;
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::push_back
            (&pMesh->mSubMeshes,&local_1d8);
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.mMaterial._M_dataplus._M_p != &local_1d8.mMaterial.field_2) {
    operator_delete(local_1d8.mMaterial._M_dataplus._M_p,
                    CONCAT71(local_1d8.mMaterial.field_2._M_allocated_capacity._1_7_,
                             local_1d8.mMaterial.field_2._M_local_buf[0]) + 1);
  }
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&local_218);
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaParser::ReadIndexData(Mesh* pMesh)
{
    std::vector<size_t> vcount;
    std::vector<InputChannel> perIndexData;

    // read primitive count from the attribute
    int attrCount = GetAttribute("count");
    size_t numPrimitives = (size_t)mReader->getAttributeValueAsInt(attrCount);
    // some mesh types (e.g. tristrips) don't specify primitive count upfront,
    // so we need to sum up the actual number of primitives while we read the <p>-tags
    size_t actualPrimitives = 0;

    // material subgroup
    int attrMaterial = TestAttribute("material");
    SubMesh subgroup;
    if (attrMaterial > -1)
        subgroup.mMaterial = mReader->getAttributeValue(attrMaterial);

    // distinguish between polys and triangles
    std::string elementName = mReader->getNodeName();
    PrimitiveType primType = Prim_Invalid;
    if (IsElement("lines"))
        primType = Prim_Lines;
    else if (IsElement("linestrips"))
        primType = Prim_LineStrip;
    else if (IsElement("polygons"))
        primType = Prim_Polygon;
    else if (IsElement("polylist"))
        primType = Prim_Polylist;
    else if (IsElement("triangles"))
        primType = Prim_Triangles;
    else if (IsElement("trifans"))
        primType = Prim_TriFans;
    else if (IsElement("tristrips"))
        primType = Prim_TriStrips;

    ai_assert(primType != Prim_Invalid);

    // also a number of <input> elements, but in addition a <p> primitive collection and probably index counts for all primitives
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(perIndexData);
            }
            else if (IsElement("vcount"))
            {
                if (!mReader->isEmptyElement())
                {
                    if (numPrimitives)  // It is possible to define a mesh without any primitives
                    {
                        // case <polylist> - specifies the number of indices for each polygon
                        const char* content = GetTextContent();
                        vcount.reserve(numPrimitives);
                        for (unsigned int a = 0; a < numPrimitives; a++)
                        {
                            if (*content == 0)
                                ThrowException("Expected more values while reading <vcount> contents.");
                            // read a number
                            vcount.push_back((size_t)strtoul10(content, &content));
                            // skip whitespace after it
                            SkipSpacesAndLineEnd(&content);
                        }
                    }

                    TestClosing("vcount");
                }
            }
            else if (IsElement("p"))
            {
                if (!mReader->isEmptyElement())
                {
                    // now here the actual fun starts - these are the indices to construct the mesh data from
                    actualPrimitives += ReadPrimitives(pMesh, perIndexData, numPrimitives, vcount, primType);
                }
            }
            else if (IsElement("extra"))
            {
                SkipElement("extra");
            }
            else if (IsElement("ph")) {
                SkipElement("ph");
            }
            else {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <" << elementName << ">");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (mReader->getNodeName() != elementName)
                ThrowException(format() << "Expected end of <" << elementName << "> element.");

            break;
        }
    }

#ifdef ASSIMP_BUILD_DEBUG
    if (primType != Prim_TriFans && primType != Prim_TriStrips && primType != Prim_LineStrip &&
        primType != Prim_Lines) { // this is ONLY to workaround a bug in SketchUp 15.3.331 where it writes the wrong 'count' when it writes out the 'lines'.
        ai_assert(actualPrimitives == numPrimitives);
    }
#endif

    // only when we're done reading all <p> tags (and thus know the final vertex count) can we commit the submesh
    subgroup.mNumFaces = actualPrimitives;
    pMesh->mSubMeshes.push_back(subgroup);
}